

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::updateEditorGeometries(QAbstractItemView *this)

{
  bool bVar1;
  QAbstractItemViewPrivate *i_00;
  QWidget **ppQVar2;
  QPersistentModelIndex *__filename;
  long lVar3;
  qsizetype qVar4;
  const_reference ppQVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  int i_1;
  int i;
  QAbstractItemDelegate *delegate;
  QWidget *editor;
  QAbstractItemViewPrivate *d;
  QModelIndex index;
  QWidgetList editorsToHide;
  QWidgetList editorsToRelease;
  iterator it;
  QStyleOptionViewItem option;
  parameter_type in_stack_fffffffffffffe18;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe20;
  iterator *in_stack_fffffffffffffe28;
  QWidget *in_stack_fffffffffffffe30;
  QHash<QWidget_*,_QPersistentModelIndex> *in_stack_fffffffffffffe38;
  QIndexEditorHash *this_00;
  int iVar7;
  int iVar8;
  QWidget *in_stack_fffffffffffffe58;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe60;
  piter in_stack_fffffffffffffe80;
  const_iterator local_170;
  piter local_160;
  undefined1 local_150 [16];
  QPersistentModelIndex local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  piter local_128;
  QList<QWidget_*> local_118;
  QList<QWidget_*> local_100;
  piter local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  i_00 = d_func((QAbstractItemView *)0x80a790);
  bVar1 = QHash<QWidget_*,_QPersistentModelIndex>::isEmpty(&i_00->editorIndexHash);
  if (!bVar1) {
    if ((i_00->delayedPendingLayout & 1U) == 0) {
      memset(local_d8,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80a7f2);
      (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
      local_e8.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)
                   &DAT_aaaaaaaaaaaaaaaa;
      local_e8 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::begin(in_stack_fffffffffffffe38);
      local_100.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_100.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      local_100.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QWidget_*>::QList((QList<QWidget_*> *)0x80a881);
      local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<QWidget_*>::QList((QList<QWidget_*> *)0x80a8bb);
      while( true ) {
        local_128 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::end
                                     ((QHash<QWidget_*,_QPersistentModelIndex> *)
                                      in_stack_fffffffffffffe28);
        bVar1 = QHash<QWidget_*,_QPersistentModelIndex>::iterator::operator!=
                          (in_stack_fffffffffffffe28,(iterator *)in_stack_fffffffffffffe20);
        if (!bVar1) break;
        local_140.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        local_138 = &DAT_aaaaaaaaaaaaaaaa;
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        QHash<QWidget_*,_QPersistentModelIndex>::iterator::value((iterator *)0x80a934);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140);
        ppQVar2 = QHash<QWidget_*,_QPersistentModelIndex>::iterator::key((iterator *)0x80a951);
        in_stack_fffffffffffffe60 = (QAbstractItemViewPrivate *)*ppQVar2;
        bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffffe20);
        if ((bVar1) && (in_stack_fffffffffffffe60 != (QAbstractItemViewPrivate *)0x0)) {
          auVar6 = (**(code **)(*in_RDI + 0x1e0))(in_RDI,&local_140);
          local_150 = auVar6;
          local_c8 = auVar6;
          bVar1 = QRect::isValid((QRect *)in_stack_fffffffffffffe20);
          if (bVar1) {
            QWidget::show(in_stack_fffffffffffffe30);
            in_stack_fffffffffffffe58 = (QWidget *)(**(code **)(*in_RDI + 0x208))(in_RDI,&local_140)
            ;
            if (in_stack_fffffffffffffe58 != (QWidget *)0x0) {
              (**(code **)(*(long *)in_stack_fffffffffffffe58 + 0x90))
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,local_d8,&local_140);
            }
          }
          else {
            QList<QWidget_*>::operator<<
                      ((QList<QWidget_*> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          }
          QHash<QWidget_*,_QPersistentModelIndex>::iterator::operator++
                    ((iterator *)in_stack_fffffffffffffe30);
        }
        else {
          this_00 = &i_00->indexEditorHash;
          __filename = QHash<QWidget_*,_QPersistentModelIndex>::iterator::value
                                 ((iterator *)0x80aa6b);
          QHash<QPersistentModelIndex,_QEditorInfo>::remove(this_00,(char *)__filename);
          QHash<QWidget_*,_QPersistentModelIndex>::const_iterator::const_iterator
                    (&local_170,(iterator *)&local_e8);
          local_160 = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase
                                       ((QHash<QWidget_*,_QPersistentModelIndex> *)this_00,
                                        (const_iterator)in_stack_fffffffffffffe80);
          local_e8 = local_160;
          QList<QWidget_*>::operator<<
                    ((QList<QWidget_*> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
      }
      iVar8 = 0;
      while( true ) {
        lVar3 = (long)iVar8;
        qVar4 = QList<QWidget_*>::size(&local_118);
        if (qVar4 <= lVar3) break;
        QList<QWidget_*>::at
                  ((QList<QWidget_*> *)in_stack_fffffffffffffe20,
                   (qsizetype)in_stack_fffffffffffffe18);
        QWidget::hide((QWidget *)0x80ab3e);
        iVar8 = iVar8 + 1;
      }
      iVar7 = 0;
      while( true ) {
        lVar3 = (long)iVar7;
        qVar4 = QList<QWidget_*>::size(&local_100);
        if (qVar4 <= lVar3) break;
        ppQVar5 = QList<QWidget_*>::at
                            ((QList<QWidget_*> *)in_stack_fffffffffffffe20,(qsizetype)i_00);
        in_stack_fffffffffffffe20 = (QAbstractItemViewPrivate *)*ppQVar5;
        QModelIndex::QModelIndex((QModelIndex *)0x80aba4);
        QAbstractItemViewPrivate::releaseEditor
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (QModelIndex *)CONCAT44(iVar8,iVar7));
        iVar7 = iVar7 + 1;
      }
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x80abd1);
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x80abde);
      QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)in_stack_fffffffffffffe20)
      ;
    }
    else {
      QAbstractItemViewPrivate::executePostedLayout(in_stack_fffffffffffffe20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::updateEditorGeometries()
{
    Q_D(QAbstractItemView);
    if (d->editorIndexHash.isEmpty())
        return;
    if (d->delayedPendingLayout) {
        // doItemsLayout() will end up calling this function again
        d->executePostedLayout();
        return;
    }
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    QEditorIndexHash::iterator it = d->editorIndexHash.begin();
    QWidgetList editorsToRelease;
    QWidgetList editorsToHide;
    while (it != d->editorIndexHash.end()) {
        QModelIndex index = it.value();
        QWidget *editor = it.key();
        if (index.isValid() && editor) {
            option.rect = visualRect(index);
            if (option.rect.isValid()) {
                editor->show();
                QAbstractItemDelegate *delegate = itemDelegateForIndex(index);
                if (delegate)
                    delegate->updateEditorGeometry(editor, option, index);
            } else {
                editorsToHide << editor;
            }
            ++it;
        } else {
            d->indexEditorHash.remove(it.value());
            it = d->editorIndexHash.erase(it);
            editorsToRelease << editor;
        }
    }

    //we hide and release the editor outside of the loop because it might change the focus and try
    //to change the editors hashes.
    for (int i = 0; i < editorsToHide.size(); ++i) {
        editorsToHide.at(i)->hide();
    }
    for (int i = 0; i < editorsToRelease.size(); ++i) {
        d->releaseEditor(editorsToRelease.at(i));
    }
}